

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O3

void SharpYuvInitGammaTables(void)

{
  uint32_t *puVar1;
  long lVar2;
  double dVar3;
  
  if (kGammaTablesSOk != 0) {
    return;
  }
  puVar1 = kGammaToLinearTabS;
  lVar2 = 0;
  do {
    dVar3 = (double)(int)lVar2 * 0.0009765625;
    if (dVar3 <= 0.08124285829863151) {
      dVar3 = dVar3 / 4.5;
    }
    else {
      dVar3 = pow((dVar3 + 0.09929682680944) * 0.909672415686275,2.2222222222222223);
    }
    *puVar1 = (uint32_t)(long)(dVar3 * 65536.0 + 0.5);
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 1;
  } while (lVar2 != 0x401);
  kGammaToLinearTabS[0x401] = kGammaToLinearTabS[0x400];
  puVar1 = kLinearToGammaTabS;
  lVar2 = 0;
  do {
    dVar3 = (double)(int)lVar2 * 0.001953125;
    if (dVar3 <= 0.018053968510807) {
      dVar3 = dVar3 * 4.5;
    }
    else {
      dVar3 = pow(dVar3,0.44999999999999996);
      dVar3 = dVar3 * 1.09929682680944 + -0.09929682680944;
    }
    *puVar1 = (uint32_t)(long)(dVar3 * 65536.0 + 0.5);
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 1;
  } while (lVar2 != 0x201);
  kLinearToGammaTabS[0x201] = kLinearToGammaTabS[0x200];
  kGammaTablesSOk = 1;
  return;
}

Assistant:

void SharpYuvInitGammaTables(void) {
  assert(GAMMA_TO_LINEAR_BITS <= 16);
  if (!kGammaTablesSOk) {
    int v;
    const double a = 0.09929682680944;
    const double thresh = 0.018053968510807;
    const double final_scale = 1 << GAMMA_TO_LINEAR_BITS;
    // Precompute gamma to linear table.
    {
      const double norm = 1. / GAMMA_TO_LINEAR_TAB_SIZE;
      const double a_rec = 1. / (1. + a);
      for (v = 0; v <= GAMMA_TO_LINEAR_TAB_SIZE; ++v) {
        const double g = norm * v;
        double value;
        if (g <= thresh * 4.5) {
          value = g / 4.5;
        } else {
          value = pow(a_rec * (g + a), kGammaF);
        }
        kGammaToLinearTabS[v] = (uint32_t)(value * final_scale + .5);
      }
      // to prevent small rounding errors to cause read-overflow:
      kGammaToLinearTabS[GAMMA_TO_LINEAR_TAB_SIZE + 1] =
          kGammaToLinearTabS[GAMMA_TO_LINEAR_TAB_SIZE];
    }
    // Precompute linear to gamma table.
    {
      const double scale = 1. / LINEAR_TO_GAMMA_TAB_SIZE;
      for (v = 0; v <= LINEAR_TO_GAMMA_TAB_SIZE; ++v) {
        const double g = scale * v;
        double value;
        if (g <= thresh) {
          value = 4.5 * g;
        } else {
          value = (1. + a) * pow(g, 1. / kGammaF) - a;
        }
        kLinearToGammaTabS[v] =
            (uint32_t)(final_scale * value + 0.5);
      }
      // to prevent small rounding errors to cause read-overflow:
      kLinearToGammaTabS[LINEAR_TO_GAMMA_TAB_SIZE + 1] =
          kLinearToGammaTabS[LINEAR_TO_GAMMA_TAB_SIZE];
    }
    kGammaTablesSOk = 1;
  }
}